

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

ssize_t uv__getrandom(void *buf,size_t buflen,uint flags)

{
  long lVar1;
  ssize_t rc;
  uint flags_local;
  size_t buflen_local;
  void *buf_local;
  
  lVar1 = syscall(0x13e,buf,buflen,(ulong)flags);
  return lVar1;
}

Assistant:

ssize_t uv__getrandom(void* buf, size_t buflen, unsigned flags) {
#if !defined(__NR_getrandom) || defined(__ANDROID_API__) && __ANDROID_API__ < 28
  return errno = ENOSYS, -1;
#else
  ssize_t rc;

  rc = syscall(__NR_getrandom, buf, buflen, flags);
  if (rc >= 0)
    uv__msan_unpoison(buf, buflen);

  return rc;
#endif
}